

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::SendException
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode,U8 ExceptionCode)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  U16 UVar4;
  U16 LRCvalue;
  U16 CRCValue;
  U8 ExceptionCode_local;
  U8 FuncCode_local;
  U8 DeviceID_local;
  ModbusSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  if ((this->mSettings->mModbusMode == ModbusRTUClient) ||
     (this->mSettings->mModbusMode == ModbusRTUServer)) {
    CreateModbusByte(this,(ulong)DeviceID);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(FuncCode + 0x80));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(ulong)ExceptionCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    UVar4 = update_CRC(this,0xffff,DeviceID);
    UVar4 = update_CRC(this,UVar4,FuncCode + 0x80);
    UVar4 = update_CRC(this,UVar4,ExceptionCode);
    CreateModbusByte(this,(long)(int)(UVar4 & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(UVar4 & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else {
    bVar2 = (DeviceID + FuncCode + 0x80 + ExceptionCode ^ 0xff) + 1;
    CreateModbusByte(this,0x3a);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,(U8)((int)(uint)DeviceID >> 4));
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,DeviceID & 0xf);
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,(U8)((int)(FuncCode + 0x80) >> 4));
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,FuncCode & 0xf);
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,(U8)((int)(ExceptionCode & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,ExceptionCode & 0xf);
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,(U8)((int)(bVar2 & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar3 = BinToLATIN1(this,bVar2 & 0xf);
    CreateModbusByte(this,(long)cVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendException( U8 DeviceID, U8 FuncCode, U8 ExceptionCode )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode + 0x80 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ExceptionCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, ( FuncCode + 0x80 ) );
        CRCValue = update_CRC( CRCValue, ExceptionCode );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + ( FuncCode + 0x80 );
        LRCvalue = LRCvalue + ( ExceptionCode );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FuncCode + 0x80 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ExceptionCode & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ExceptionCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}